

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O1

void __thiscall Fl_TooltipBox::layout(Fl_TooltipBox *this)

{
  int iVar1;
  Fl_Window *this_00;
  uint uVar2;
  uint uVar3;
  int scr_y;
  int hh;
  int scr_h;
  int ww;
  int scr_w;
  int scr_x;
  int y;
  int x;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  int local_30;
  int local_2c;
  
  uVar3 = Fl_Tooltip::size_;
  if (Fl_Tooltip::size_ == -1) {
    uVar3 = FL_NORMAL_SIZE;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)Fl_Tooltip::font_,(ulong)uVar3);
  local_3c = 400;
  local_44 = 0;
  fl_measure(tip,(int *)&local_3c,(int *)&local_44,1);
  iVar1 = Fl::e_x_root;
  local_3c = local_3c + 6;
  local_44 = local_44 + 6;
  uVar3 = ::Y + ::H + 2;
  for (this_00 = (Fl_Window *)Fl_Tooltip::widget_; this_00 != (Fl_Window *)0x0;
      this_00 = Fl_Widget::window((Fl_Widget *)this_00)) {
    uVar3 = uVar3 + (this_00->super_Fl_Group).super_Fl_Widget.y_;
  }
  Fl::get_mouse(&local_2c,&local_30);
  Fl::screen_xywh((int *)&local_34,(int *)&local_48,&local_38,&local_40,local_2c,local_30);
  if (::H < 0x1f) {
    if ((int)(local_40 + local_48) < (int)(local_44 + uVar3)) {
      uVar3 = (uVar3 - (::H + local_44)) - 4;
    }
  }
  else if ((int)(local_40 + local_48) < (int)(local_44 + Fl::e_y_root + 0xd)) {
    uVar3 = (Fl::e_y_root - local_44) - 10;
  }
  else {
    uVar3 = Fl::e_y_root + 0xd;
  }
  uVar2 = (local_38 + local_34) - local_3c;
  if ((int)(local_3c + iVar1) <= (int)(local_38 + local_34)) {
    uVar2 = iVar1;
  }
  if ((int)uVar2 <= (int)local_34) {
    uVar2 = local_34;
  }
  if ((int)local_48 < (int)uVar3) {
    local_48 = uVar3;
  }
  (*(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget._vptr_Fl_Widget[4])
            (this,(ulong)uVar2,(ulong)local_48,(ulong)local_3c,(ulong)local_44);
  return;
}

Assistant:

void Fl_TooltipBox::layout() {
  fl_font(Fl_Tooltip::font(), Fl_Tooltip::size());
  int ww = Fl_Tooltip::wrap_width();
  int hh = 0;
  fl_measure(tip, ww, hh, draw_symbols_);
  ww += (Fl_Tooltip::margin_width() * 2);
  hh += (Fl_Tooltip::margin_height() * 2);

  // find position on the screen of the widget:
  int ox = Fl::event_x_root();
  int oy = Y + H+2;
  for (Fl_Widget* p = Fl_Tooltip::current(); p; p = p->window()) {
    oy += p->y();
  }
  int scr_x, scr_y, scr_w, scr_h;
  Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
  if (ox+ww > scr_x+scr_w) ox = scr_x+scr_w - ww;
  if (ox < scr_x) ox = scr_x;
  if (H > 30) {
    oy = Fl::event_y_root()+13;
    if (oy+hh > scr_y+scr_h) oy -= 23+hh;
  } else {
    if (oy+hh > scr_y+scr_h) oy -= (4+hh+H);
  }
  if (oy < scr_y) oy = scr_y;

  resize(ox, oy, ww, hh);
}